

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O1

RealType __thiscall OpenMD::Thermo::getKinetic(Thermo *this)

{
  Snapshot *this_00;
  RealType RVar1;
  RealType RVar2;
  RealType RVar3;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  if (this_00->hasKineticEnergy == false) {
    RVar1 = getTranslationalKinetic(this);
    RVar2 = getRotationalKinetic(this);
    RVar3 = getElectronicKinetic(this);
    Snapshot::setKineticEnergy(this_00,RVar3 + RVar2 + RVar1);
  }
  RVar1 = Snapshot::getKineticEnergy(this_00);
  return RVar1;
}

Assistant:

RealType Thermo::getKinetic() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasKineticEnergy) {
      RealType ke = getTranslationalKinetic() + getRotationalKinetic() +
                    getElectronicKinetic();

      snap->setKineticEnergy(ke);
    }
    return snap->getKineticEnergy();
  }